

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

void __thiscall mario::EventLoop::loop(EventLoop *this)

{
  pointer ppCVar1;
  int iVar2;
  undefined4 extraout_var;
  Writer *pWVar3;
  undefined8 in_RCX;
  ChannelList *__range2;
  pointer ppCVar4;
  EventLoop *local_a0;
  Writer local_98;
  
  assertInLoopThread(this);
  this->_looping = true;
  this->_quit = false;
  do {
    ppCVar4 = (this->_activeChannels).
              super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->_activeChannels).
        super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar4) {
      (this->_activeChannels).
      super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar4;
    }
    iVar2 = EPoller::poll((this->_poller)._M_t.
                          super___uniq_ptr_impl<mario::EPoller,_std::default_delete<mario::EPoller>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mario::EPoller_*,_std::default_delete<mario::EPoller>_>
                          .super__Head_base<0UL,_mario::EPoller_*,_false>._M_head_impl,
                          (pollfd *)0x2710,(nfds_t)&this->_activeChannels,(int)in_RCX);
    (this->_pollReturnTime)._microSecondsSinceEpoch = CONCAT44(extraout_var,iVar2);
    ppCVar1 = (this->_activeChannels).
              super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar4 = (this->_activeChannels).
                   super__Vector_base<mario::Channel_*,_std::allocator<mario::Channel_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
      Channel::handleEvent(*ppCVar4,(Timestamp)(this->_pollReturnTime)._microSecondsSinceEpoch);
    }
    doPendingFunctors(this);
  } while (this->_quit == false);
  local_98._vptr_Writer = (_func_int **)&PTR__Writer_00134af0;
  local_98.m_msg = (LogMessage *)0x0;
  local_98.m_level = Info;
  local_98.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/EventLoop.cpp"
  ;
  local_98.m_line = 0x48;
  local_98.m_func = "void mario::EventLoop::loop()";
  local_98.m_verboseLevel = 0;
  local_98.m_logger = (Logger *)0x0;
  local_98.m_proceed = false;
  local_98.m_messageBuilder.m_logger = (Logger *)0x0;
  local_98.m_messageBuilder.m_containerLogSeperator = "";
  local_98.m_dispatchAction = NormalLog;
  local_98.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar3 = el::base::Writer::construct(&local_98,1,"default");
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,"EventLoop");
  }
  local_a0 = this;
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,&local_a0);
  }
  if (pWVar3->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder," stop looping");
  }
  el::base::Writer::~Writer(&local_98);
  this->_looping = false;
  return;
}

Assistant:

void EventLoop::loop() {
	assertInLoopThread();
	_looping = true;
    _quit = false;

    while (!_quit) {
        _activeChannels.clear();
        _pollReturnTime = _poller->poll(kPollTimeMs, &_activeChannels);
        for (auto channel_p : _activeChannels) {
            channel_p->handleEvent(_pollReturnTime);
        }

        doPendingFunctors();
    }

	LOG(INFO) << "EventLoop" << this << " stop looping";
	_looping = false;
}